

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator/=(base_uint<256U> *this,base_uint<256U> *b)

{
  uint uVar1;
  uint uVar2;
  runtime_error *this_00;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar5;
  base_uint<256U> num;
  base_uint<256U> div;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  base_uint<256U> local_70;
  base_uint<256U> local_50;
  long local_30;
  ulong uVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&local_50,b);
  base_uint(&local_70,this);
  this->pn[4] = 0;
  this->pn[5] = 0;
  this->pn[6] = 0;
  this->pn[7] = 0;
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  uVar1 = bits(&local_70);
  uVar2 = bits(&local_50);
  if (uVar2 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Division by zero","");
    std::runtime_error::runtime_error(this_00,(string *)local_90);
    *(undefined ***)this_00 = &PTR__runtime_error_001c9f30;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&uint_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if ((int)uVar2 <= (int)uVar1) {
      operator<<=(&local_50,uVar1 - uVar2);
      if (-1 < (int)(uVar1 - uVar2)) {
        uVar1 = uVar1 - uVar2;
        do {
          uVar2 = 7;
          do {
            uVar3 = (ulong)uVar2;
            uVar4 = (ulong)uVar2;
            if (local_70.pn[uVar3] < local_50.pn[uVar4]) goto LAB_00154615;
            bVar5 = uVar2 != 0;
            uVar2 = uVar2 - 1;
          } while ((bVar5) && (local_70.pn[uVar3] <= local_50.pn[uVar4]));
          operator-=(&local_70,&local_50);
          this->pn[uVar1 >> 5] = this->pn[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
LAB_00154615:
          operator>>=(&local_50,1);
          bVar5 = 0 < (int)uVar1;
          uVar1 = uVar1 - 1;
        } while (bVar5);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return this;
    }
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator/=(const base_uint& b)
{
    base_uint<BITS> div = b;     // make a copy, so we can shift.
    base_uint<BITS> num = *this; // make a copy, so we can subtract.
    *this = 0;                   // the quotient.
    int num_bits = num.bits();
    int div_bits = div.bits();
    if (div_bits == 0)
        throw uint_error("Division by zero");
    if (div_bits > num_bits) // the result is certainly 0.
        return *this;
    int shift = num_bits - div_bits;
    div <<= shift; // shift so that div and num align.
    while (shift >= 0) {
        if (num >= div) {
            num -= div;
            pn[shift / 32] |= (1U << (shift & 31)); // set a bit of the result.
        }
        div >>= 1; // shift back.
        shift--;
    }
    // num now contains the remainder of the division.
    return *this;
}